

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O2

void __thiscall
cmExportFileGenerator::PopulateCompatibleInterfaceProperties
          (cmExportFileGenerator *this,cmGeneratorTarget *gtarget,ImportPropertyMap *properties)

{
  _Rb_tree_header *p_Var1;
  TargetType TVar2;
  _Base_ptr p_Var3;
  cmExportFileGenerator *pcVar4;
  pointer config;
  allocator local_a9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configNames;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ifaceProperties;
  string local_50;
  
  pcVar4 = (cmExportFileGenerator *)&ifaceProperties;
  std::__cxx11::string::string
            ((string *)pcVar4,"COMPATIBLE_INTERFACE_BOOL",(allocator *)&configNames);
  PopulateInterfaceProperty(pcVar4,(string *)&ifaceProperties,gtarget,properties);
  std::__cxx11::string::~string((string *)&ifaceProperties);
  pcVar4 = (cmExportFileGenerator *)&ifaceProperties;
  std::__cxx11::string::string
            ((string *)pcVar4,"COMPATIBLE_INTERFACE_STRING",(allocator *)&configNames);
  PopulateInterfaceProperty(pcVar4,(string *)&ifaceProperties,gtarget,properties);
  std::__cxx11::string::~string((string *)&ifaceProperties);
  pcVar4 = (cmExportFileGenerator *)&ifaceProperties;
  std::__cxx11::string::string
            ((string *)pcVar4,"COMPATIBLE_INTERFACE_NUMBER_MIN",(allocator *)&configNames);
  PopulateInterfaceProperty(pcVar4,(string *)&ifaceProperties,gtarget,properties);
  std::__cxx11::string::~string((string *)&ifaceProperties);
  pcVar4 = (cmExportFileGenerator *)&ifaceProperties;
  std::__cxx11::string::string
            ((string *)pcVar4,"COMPATIBLE_INTERFACE_NUMBER_MAX",(allocator *)&configNames);
  PopulateInterfaceProperty(pcVar4,(string *)&ifaceProperties,gtarget,properties);
  std::__cxx11::string::~string((string *)&ifaceProperties);
  p_Var1 = &ifaceProperties._M_t._M_impl.super__Rb_tree_header;
  ifaceProperties._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  ifaceProperties._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  ifaceProperties._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  ifaceProperties._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  ifaceProperties._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  std::__cxx11::string::string((string *)&configNames,"COMPATIBLE_INTERFACE_BOOL",&local_a9);
  getPropertyContents(gtarget,(string *)&configNames,&ifaceProperties);
  std::__cxx11::string::~string((string *)&configNames);
  std::__cxx11::string::string((string *)&configNames,"COMPATIBLE_INTERFACE_STRING",&local_a9);
  getPropertyContents(gtarget,(string *)&configNames,&ifaceProperties);
  std::__cxx11::string::~string((string *)&configNames);
  std::__cxx11::string::string((string *)&configNames,"COMPATIBLE_INTERFACE_NUMBER_MIN",&local_a9);
  getPropertyContents(gtarget,(string *)&configNames,&ifaceProperties);
  std::__cxx11::string::~string((string *)&configNames);
  std::__cxx11::string::string((string *)&configNames,"COMPATIBLE_INTERFACE_NUMBER_MAX",&local_a9);
  getPropertyContents(gtarget,(string *)&configNames,&ifaceProperties);
  std::__cxx11::string::~string((string *)&configNames);
  TVar2 = cmGeneratorTarget::GetType(gtarget);
  if (TVar2 != INTERFACE_LIBRARY) {
    std::__cxx11::string::string((string *)&configNames,"",&local_a9);
    getCompatibleInterfaceProperties(gtarget,&ifaceProperties,(string *)&configNames);
    std::__cxx11::string::~string((string *)&configNames);
    configNames.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    configNames.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    configNames.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    cmMakefile::GetConfigurations(&local_50,gtarget->Target->Makefile,&configNames,true);
    std::__cxx11::string::~string((string *)&local_50);
    for (config = configNames.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        config != configNames.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; config = config + 1) {
      getCompatibleInterfaceProperties(gtarget,&ifaceProperties,config);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&configNames);
  }
  for (p_Var3 = ifaceProperties._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != p_Var1; p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    pcVar4 = (cmExportFileGenerator *)&configNames;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&configNames
                   ,"INTERFACE_",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var3 + 1)
                  );
    PopulateInterfaceProperty(pcVar4,(string *)&configNames,gtarget,properties);
    std::__cxx11::string::~string((string *)&configNames);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&ifaceProperties._M_t);
  return;
}

Assistant:

void cmExportFileGenerator::PopulateCompatibleInterfaceProperties(
                                cmGeneratorTarget *gtarget,
                                ImportPropertyMap &properties)
{
  this->PopulateInterfaceProperty("COMPATIBLE_INTERFACE_BOOL",
                                gtarget, properties);
  this->PopulateInterfaceProperty("COMPATIBLE_INTERFACE_STRING",
                                gtarget, properties);
  this->PopulateInterfaceProperty("COMPATIBLE_INTERFACE_NUMBER_MIN",
                                gtarget, properties);
  this->PopulateInterfaceProperty("COMPATIBLE_INTERFACE_NUMBER_MAX",
                                gtarget, properties);

  std::set<std::string> ifaceProperties;

  getPropertyContents(gtarget, "COMPATIBLE_INTERFACE_BOOL", ifaceProperties);
  getPropertyContents(gtarget, "COMPATIBLE_INTERFACE_STRING", ifaceProperties);
  getPropertyContents(gtarget, "COMPATIBLE_INTERFACE_NUMBER_MIN",
                      ifaceProperties);
  getPropertyContents(gtarget, "COMPATIBLE_INTERFACE_NUMBER_MAX",
                      ifaceProperties);

  if (gtarget->GetType() != cmState::INTERFACE_LIBRARY)
    {
    getCompatibleInterfaceProperties(gtarget, ifaceProperties, "");

    std::vector<std::string> configNames;
    gtarget->Target->GetMakefile()->GetConfigurations(configNames);

    for (std::vector<std::string>::const_iterator ci = configNames.begin();
      ci != configNames.end(); ++ci)
      {
      getCompatibleInterfaceProperties(gtarget, ifaceProperties, *ci);
      }
    }

  for (std::set<std::string>::const_iterator it = ifaceProperties.begin();
    it != ifaceProperties.end(); ++it)
    {
    this->PopulateInterfaceProperty("INTERFACE_" + *it,
                                    gtarget, properties);
    }
}